

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *ilimit_w;
  ulong *iLimit;
  BYTE *pBVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  U32 lowestValid;
  uint uVar6;
  ulong uVar7;
  seqDef *psVar8;
  ulong *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  BYTE *pInLoopLimit;
  BYTE *litEnd;
  ulong *ip;
  ulong *puVar20;
  BYTE *pBVar21;
  BYTE *litLimit_w;
  size_t offbaseFound;
  size_t local_78;
  ulong *local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  BYTE *local_50;
  ulong *local_48;
  ulong *local_40;
  uint *local_38;
  
  iLimit = (ulong *)((long)src + srcSize);
  pBVar21 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  local_50 = pBVar21 + uVar6;
  uVar19 = (ms->cParams).minMatch;
  uVar16 = 6;
  if (uVar19 < 6) {
    uVar16 = uVar19;
  }
  local_5c = 4;
  if (4 < uVar16) {
    local_5c = uVar16;
  }
  local_60 = *rep;
  ip = (ulong *)((ulong)((int)src == (int)local_50) + (long)src);
  iVar13 = (int)ip - (int)pBVar21;
  uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_64 = iVar13 - uVar19;
  if (iVar13 - uVar6 <= uVar19) {
    local_64 = uVar6;
  }
  if (ms->loadedDictEnd != 0) {
    local_64 = uVar6;
  }
  local_68 = rep[1];
  local_64 = iVar13 - local_64;
  uVar6 = local_68;
  if (local_64 < local_68) {
    uVar6 = 0;
  }
  uVar14 = (ulong)uVar6;
  uVar19 = local_60;
  if (local_64 < local_60) {
    uVar19 = 0;
  }
  uVar12 = (ulong)uVar19;
  local_70 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (ip < local_70) {
    puVar1 = (ulong *)((long)iLimit - 7);
    local_40 = (ulong *)((long)iLimit + -3);
    local_48 = (ulong *)((long)iLimit + -1);
    ilimit_w = iLimit + -4;
    local_38 = rep;
    do {
      uVar7 = uVar12;
      if (((int)uVar12 == 0) || (*(int *)(((long)ip + 1) - uVar12) != *(int *)((long)ip + 1))) {
        local_78 = 999999999;
        if (local_5c == 6) {
          uVar18 = ZSTD_HcFindBestMatch_noDict_6(ms,(BYTE *)ip,(BYTE *)iLimit,&local_78);
        }
        else if (local_5c == 5) {
          uVar18 = ZSTD_HcFindBestMatch_noDict_5(ms,(BYTE *)ip,(BYTE *)iLimit,&local_78);
        }
        else {
          uVar18 = ZSTD_HcFindBestMatch_noDict_4(ms,(BYTE *)ip,(BYTE *)iLimit,&local_78);
        }
        uVar11 = local_78;
        if (uVar18 == 0) {
          uVar11 = 1;
        }
        if (3 < uVar18) {
          if (3 < local_78) {
            if ((src < ip) && (local_50 < (BYTE *)((long)ip + (3 - local_78)))) {
              puVar20 = ip;
              while (ip = puVar20,
                    *(char *)((long)puVar20 - 1) == *(char *)((long)puVar20 + (2 - local_78))) {
                ip = (ulong *)((long)puVar20 - 1);
                uVar18 = uVar18 + 1;
                if ((ip <= src) ||
                   (pBVar21 = (BYTE *)((long)puVar20 + (2 - local_78)), puVar20 = ip,
                   pBVar21 <= local_50)) break;
              }
            }
            uVar7 = (ulong)((int)uVar11 - 3);
            uVar14 = uVar12;
          }
          goto LAB_00166f80;
        }
        uVar7 = (long)ip - (long)src;
        ip = (ulong *)((long)ip + (uVar7 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar7);
      }
      else {
        lVar10 = -uVar12;
        puVar20 = (ulong *)((long)ip + 5);
        puVar9 = (ulong *)((long)ip + lVar10 + 5);
        puVar15 = puVar20;
        if (puVar20 < puVar1) {
          if (*puVar9 == *puVar20) {
            lVar17 = 0;
            do {
              puVar15 = (ulong *)((long)ip + lVar17 + 0xd);
              if (puVar1 <= puVar15) {
                puVar9 = (ulong *)((long)ip + lVar10 + lVar17 + 0xd);
                puVar15 = (ulong *)((long)ip + lVar17 + 0xd);
                goto LAB_00166f34;
              }
              uVar12 = *(ulong *)((long)ip + lVar17 + lVar10 + 0xd);
              uVar18 = *puVar15;
              lVar17 = lVar17 + 8;
            } while (uVar12 == uVar18);
            uVar18 = uVar18 ^ uVar12;
            uVar12 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar18 = (uVar12 >> 3 & 0x1fffffff) + lVar17;
          }
          else {
            uVar18 = *puVar20 ^ *puVar9;
            uVar12 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar18 = uVar12 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00166f34:
          if ((puVar15 < local_40) && ((int)*puVar9 == (int)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar9 = (ulong *)((long)puVar9 + 4);
          }
          if ((puVar15 < local_48) && ((short)*puVar9 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar9 = (ulong *)((long)puVar9 + 2);
          }
          if (puVar15 < iLimit) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar15));
          }
          uVar18 = (long)puVar15 - (long)puVar20;
        }
        uVar18 = uVar18 + 4;
        uVar11 = 1;
        ip = (ulong *)((long)ip + 1);
LAB_00166f80:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00167387:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001673e4:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar12 = (long)ip - (long)src;
        puVar20 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar20 + uVar12)) {
LAB_001673a6:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < ip) {
LAB_001673c5:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < ip) {
          local_58 = uVar11;
          ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_00166ffb:
          seqStore->lit = seqStore->lit + uVar12;
          uVar11 = local_58;
          if (0xffff < uVar12) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(ulong *)((long)src + 8);
          *puVar20 = *src;
          puVar20[1] = uVar4;
          pBVar21 = seqStore->lit;
          if (0x10 < uVar12) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              local_58 = uVar11;
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar21 + 0x18) = uVar4;
            local_58 = uVar11;
            if (0x20 < (long)uVar12) {
              lVar10 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar10 + 0x20);
                uVar5 = puVar3[1];
                pBVar2 = pBVar21 + lVar10 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar5;
                puVar3 = (undefined8 *)((long)src + lVar10 + 0x30);
                uVar5 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                lVar10 = lVar10 + 0x20;
              } while (pBVar2 + 0x20 < pBVar21 + uVar12);
            }
            goto LAB_00166ffb;
          }
          seqStore->lit = pBVar21 + uVar12;
        }
        psVar8 = seqStore->sequences;
        psVar8->litLength = (U16)uVar12;
        psVar8->offBase = (U32)uVar11;
        if (uVar18 < 3) {
LAB_00167368:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar18 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00167403:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8->mlBase = (U16)(uVar18 - 3);
        psVar8 = psVar8 + 1;
        seqStore->sequences = psVar8;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        ip = (ulong *)((long)ip + uVar18);
        uVar12 = uVar7;
        src = ip;
        if (((int)uVar14 != 0) && (uVar18 = uVar14, ip <= local_70)) {
          while (uVar11 = uVar7, uVar12 = uVar11, uVar14 = uVar18, src = ip,
                (int)*ip == *(int *)((long)ip - uVar18)) {
            lVar10 = -uVar18;
            puVar20 = (ulong *)((long)ip + 4);
            puVar9 = (ulong *)((long)ip + lVar10 + 4);
            puVar15 = puVar20;
            if (puVar20 < puVar1) {
              if (*puVar9 == *puVar20) {
                lVar17 = 0;
                do {
                  puVar15 = (ulong *)((long)ip + lVar17 + 0xc);
                  if (puVar1 <= puVar15) {
                    puVar9 = (ulong *)((long)ip + lVar10 + lVar17 + 0xc);
                    puVar15 = (ulong *)((long)ip + lVar17 + 0xc);
                    goto LAB_001671d2;
                  }
                  uVar14 = *(ulong *)((long)ip + lVar17 + lVar10 + 0xc);
                  uVar12 = *puVar15;
                  lVar17 = lVar17 + 8;
                } while (uVar14 == uVar12);
                uVar12 = uVar12 ^ uVar14;
                uVar14 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = (uVar14 >> 3 & 0x1fffffff) + lVar17;
              }
              else {
                uVar12 = *puVar20 ^ *puVar9;
                uVar14 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                uVar14 = uVar14 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001671d2:
              if ((puVar15 < local_40) && ((int)*puVar9 == (int)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 4);
                puVar9 = (ulong *)((long)puVar9 + 4);
              }
              if ((puVar15 < local_48) && ((short)*puVar9 == (short)*puVar15)) {
                puVar15 = (ulong *)((long)puVar15 + 2);
                puVar9 = (ulong *)((long)puVar9 + 2);
              }
              if (puVar15 < iLimit) {
                puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar15));
              }
              uVar14 = (long)puVar15 - (long)puVar20;
            }
            if (seqStore->maxNbSeq <= (ulong)((long)psVar8 - (long)seqStore->sequencesStart >> 3))
            goto LAB_00167387;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001673e4;
            puVar20 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar20) goto LAB_001673a6;
            if (iLimit < ip) goto LAB_001673c5;
            if (ilimit_w < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
            }
            else {
              uVar12 = ip[1];
              *puVar20 = *ip;
              puVar20[1] = uVar12;
            }
            psVar8 = seqStore->sequences;
            psVar8->litLength = 0;
            psVar8->offBase = 1;
            if (uVar14 + 4 < 3) goto LAB_00167368;
            if (0xffff < uVar14 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00167403;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar8->mlBase = (U16)(uVar14 + 1);
            psVar8 = psVar8 + 1;
            seqStore->sequences = psVar8;
            ip = (ulong *)((long)ip + uVar14 + 4);
            uVar12 = uVar18;
            uVar14 = uVar11;
            src = ip;
            if (((int)uVar11 == 0) || (uVar7 = uVar18, uVar18 = uVar11, local_70 < ip)) break;
          }
        }
      }
      uVar6 = (uint)uVar14;
      uVar19 = (uint)uVar12;
      rep = local_38;
    } while (ip < local_70);
  }
  if (local_68 <= local_64) {
    local_68 = 0;
  }
  uVar16 = local_68;
  if (uVar19 != 0) {
    uVar16 = local_60;
  }
  if (local_60 <= local_64) {
    uVar16 = local_68;
    local_60 = 0;
  }
  if (uVar19 != 0) {
    local_60 = uVar19;
  }
  if (uVar6 != 0) {
    uVar16 = uVar6;
  }
  *rep = local_60;
  rep[1] = uVar16;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_noDict);
}